

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::save_magick
          (CImg<unsigned_char> *this,char *filename,uint bytes_per_pixel)

{
  uchar *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  CImgArgumentException *this_00;
  undefined4 in_register_00000014;
  pointer_____offset_0x10___ *ppuVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)
              __cxa_allocate_exception(0x4008,0,CONCAT44(in_register_00000014,bytes_per_pixel));
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char");
    ppuVar7 = &CImgArgumentException::typeinfo;
  }
  else {
    puVar1 = this->_data;
    uVar2 = this->_width;
    uVar3 = this->_height;
    uVar4 = this->_depth;
    uVar5 = this->_spectrum;
    this_00 = (CImgArgumentException *)
              __cxa_allocate_exception
                        (0x4008,filename,CONCAT44(in_register_00000014,bytes_per_pixel));
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    if (puVar1 != (uchar *)0x0) {
      auVar9._0_4_ = -(uint)(uVar2 == 0);
      auVar9._4_4_ = -(uint)(uVar3 == 0);
      auVar9._8_4_ = -(uint)(uVar4 == 0);
      auVar9._12_4_ = -(uint)(uVar5 == 0);
      uVar6 = movmskps(0x1560e4,auVar9);
      if ((char)uVar6 == '\0') {
        CImgIOException::CImgIOException
                  ((CImgIOException *)this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Unable to save file \'%s\' unless libMagick++ is enabled."
                  );
        ppuVar7 = &CImgIOException::typeinfo;
        goto LAB_001545ff;
      }
    }
    CImgInstanceException::CImgInstanceException
              ((CImgInstanceException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::save_magick() : Empty instance, for file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned char",filename);
    ppuVar7 = &CImgInstanceException::typeinfo;
  }
LAB_001545ff:
  __cxa_throw(this_00,ppuVar7,std::exception::~exception);
}

Assistant:

const CImg<T>& save_magick(const char *const filename, const unsigned int bytes_per_pixel=0) const {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "save_magick() : Specified filename is (null).",
                                    cimg_instance);
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "save_magick() : Empty instance, for file '%s'.",
                                    cimg_instance,
                                    filename);
#ifdef cimg_use_magick
      double stmin, stmax = (double)max_min(stmin);
      if (_depth>1)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is volumetric, only the first slice will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (_spectrum>3)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance is multispectral, only the three first channels will be saved in file '%s'.",
                   cimg_instance,
                   filename);

      if (stmin<0 || (bytes_per_pixel==1 && stmax>=256) || stmax>=65536)
        cimg::warn(_cimg_instance
                   "save_magick() : Instance has pixel values in [%g,%g], probable type overflow in file '%s'.",
                   cimg_instance,
                   filename,stmin,stmax);

      Magick::Image image(Magick::Geometry(_width,_height),"black");
      image.type(Magick::TrueColorType);
      image.depth(bytes_per_pixel?(8*bytes_per_pixel):(stmax>=256?16:8));
      const T
        *ptr_r = data(0,0,0,0),
        *ptr_g = _spectrum>1?data(0,0,0,1):0,
        *ptr_b = _spectrum>2?data(0,0,0,2):0;
      Magick::PixelPacket *pixels = image.getPixels(0,0,_width,_height);
      switch (_spectrum) {
      case 1 : // Scalar images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = pixels->green = pixels->blue = (Magick::Quantum)*(ptr_r++);
          ++pixels;
        }
        break;
      case 2 : // RG images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = 0; ++pixels;
        }
        break;
      default : // RGB images
        for (unsigned int off = _width*_height; off; --off) {
          pixels->red = (Magick::Quantum)*(ptr_r++);
          pixels->green = (Magick::Quantum)*(ptr_g++);
          pixels->blue = (Magick::Quantum)*(ptr_b++);
          ++pixels;
        }
      }
      image.syncPixels();
      image.write(filename);
#else
      cimg::unused(bytes_per_pixel);
      throw CImgIOException(_cimg_instance
                            "save_magick() : Unable to save file '%s' unless libMagick++ is enabled.",
                            cimg_instance,
                            filename);
#endif
      return *this;
    }